

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O2

String * Rct::shortOptions(String *__return_storage_ptr__,option *longOptions)

{
  uint uVar1;
  bool bVar2;
  int *piVar3;
  
  (__return_storage_ptr__->mString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mString).field_2;
  (__return_storage_ptr__->mString)._M_string_length = 0;
  (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  piVar3 = &longOptions->val;
  do {
    if (((option *)(piVar3 + -6))->name == (char *)0x0) {
      return __return_storage_ptr__;
    }
    if (*piVar3 != 0) {
      bVar2 = String::contains(__return_storage_ptr__,(char)*piVar3,CaseSensitive);
      if (bVar2) {
        printf("%c (%s) is already used\n",(ulong)(uint)*piVar3,((option *)(piVar3 + -6))->name);
        bVar2 = String::contains(__return_storage_ptr__,(char)*piVar3,CaseSensitive);
        if (bVar2) {
          __assert_fail("!ret.contains(longOptions[i].val)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Rct.cpp"
                        ,0x9a,"String Rct::shortOptions(const option *)");
        }
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar1 = piVar3[-4];
      if (uVar1 != 0) {
        if (uVar1 == 1) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        else {
          if (uVar1 != 2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Rct.cpp"
                          ,0xa7,"String Rct::shortOptions(const option *)");
          }
          String::append(__return_storage_ptr__,"::",0xffffffffffffffff);
        }
      }
    }
    piVar3 = piVar3 + 8;
  } while( true );
}

Assistant:

String shortOptions(const option *longOptions)
{
    String ret;
    for (int i=0; longOptions[i].name; ++i) {
        if (longOptions[i].val) {
            if (ret.contains(longOptions[i].val)) {
                printf("%c (%s) is already used\n", longOptions[i].val, longOptions[i].name);
                assert(!ret.contains(longOptions[i].val));
            }
            ret.append(longOptions[i].val);
            switch (longOptions[i].has_arg) {
            case no_argument:
                break;
            case optional_argument:
                ret.append("::");
                break;
            case required_argument:
                ret.append(':');
                break;
            default:
                assert(0);
                break;
            }
        }
    }
#if 0
    String unused;
    for (char ch='a'; ch<='z'; ++ch) {
        if (!ret.contains(ch)) {
            unused.append(ch);
        }
        const char upper = toupper(ch);
        if (!ret.contains(upper)) {
            unused.append(upper);
        }
    }
    printf("Unused letters: %s\n", unused.nullTerminated());
#endif
    return ret;
}